

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEdit::keyReleaseEvent(QTextEdit *this,QKeyEvent *e)

{
  long lVar1;
  QWidgetTextControl *this_00;
  QWidget *this_01;
  bool bVar2;
  TextInteractionFlags TVar3;
  QStyle *pQVar4;
  QTextEditPrivate *d;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  this_00 = *(QWidgetTextControl **)(lVar1 + 0x2f8);
  if (this_00 != (QWidgetTextControl *)0x0) {
    TVar3 = QWidgetTextControl::textInteractionFlags(this_00);
    if (((uint)TVar3.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
               super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) {
      this_01 = *(QWidget **)(lVar1 + 8);
      bVar2 = QApplication::autoSipEnabled(QCoreApplication::self);
      if (bVar2) {
        pQVar4 = QWidget::style(this_01);
        (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x5f,0,this_01,0);
        QGuiApplication::inputMethod();
        QInputMethod::show();
      }
    }
  }
  e[0xc] = (QKeyEvent)0x0;
  return;
}

Assistant:

void QTextEdit::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QTextEdit);
    if (!isReadOnly())
        d->handleSoftwareInputPanel();
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled()) {
        if (!e->isAutoRepeat() && e->key() == Qt::Key_Back
            && d->deleteAllTimer.isActive()) {
            d->deleteAllTimer.stop();
            QTextCursor cursor = d->control->textCursor();
            QTextBlockFormat blockFmt = cursor.blockFormat();

            QTextList *list = cursor.currentList();
            if (list && cursor.atBlockStart()) {
                list->remove(cursor.block());
            } else if (cursor.atBlockStart() && blockFmt.indent() > 0) {
                blockFmt.setIndent(blockFmt.indent() - 1);
                cursor.setBlockFormat(blockFmt);
            } else {
                cursor.deletePreviousChar();
            }
            setTextCursor(cursor);
            e->accept();
            return;
        }
    }
#endif
    e->ignore();
}